

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
r_code::list<core::P<r_exec::Overlay>_>::push_back
          (list<core::P<r_exec::Overlay>_> *this,P<r_exec::Overlay> *t)

{
  pointer pcVar1;
  long lVar2;
  
  if (this->free_cell_count == 0) {
    push_back_new_cell(this,t);
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = this->used_cells_tail;
  }
  else {
    lVar2 = this->free_cells;
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar2;
    this->free_cells = pcVar1->next;
    this->free_cell_count = this->free_cell_count - 1;
    core::P<r_exec::Overlay>::operator=(&pcVar1->data,t);
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1[lVar2].next = -1;
    pcVar1[lVar2].prev = this->used_cells_tail;
    this->used_cells_tail = lVar2;
  }
  if (pcVar1[lVar2].prev != -1) {
    pcVar1[pcVar1[lVar2].prev].next = lVar2;
  }
  if (this->used_cells_head == -1) {
    this->used_cells_head = lVar2;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_back(const T &t)
    {
        if (free_cell_count) {
            push_back_free_cell(t);
        } else {
            push_back_new_cell(t);
        }

        update_used_cells_tail_state();
    }